

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O0

void __thiscall clunk::Node::GetSliderChecks<true>(Node *this)

{
  char cVar1;
  uint from_00;
  uint to_00;
  int iVar2;
  int iVar3;
  uint from_01;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uStack_40;
  int from;
  uint64_t tmp;
  int to;
  int dir;
  int end;
  uint64_t mvs;
  int pinDir;
  int score;
  int king;
  Node *this_local;
  
  from_00 = (uint)(byte)_KING[1];
  if ((_KING[1] & 0x88) != 0) {
    __assert_fail("IS_SQUARE(king)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x722,"void clunk::Node::GetSliderChecks() [color = true]");
  }
  if ((undefined *)(&_board)[(int)from_00] != _KING) {
    __assert_fail("_board[king] == _KING[!color]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x723,"void clunk::Node::GetSliderChecks() [color = true]");
  }
  _dir = *(ulong *)(_queenKing + (long)(int)from_00 * 8);
  do {
    if (_dir == 0) {
      return;
    }
    if ((_dir & 0xff) == 0) {
      __assert_fail("mvs & 0xFF",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x728,"void clunk::Node::GetSliderChecks() [color = true]");
    }
    to_00 = ((uint)_dir & 0xff) - 1;
    iVar2 = Direction(from_00,to_00);
    tmp._4_4_ = from_00;
    if ((((iVar2 != -0x11 && iVar2 != -0xf) && iVar2 != 0xf) && iVar2 != 0x11) &&
        (((iVar2 != -0x10 && iVar2 != -1) && iVar2 != 1) && iVar2 != 0x10)) {
      __assert_fail("IS_DIR(dir)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x72b,"void clunk::Node::GetSliderChecks() [color = true]");
    }
    do {
      tmp._4_4_ = tmp._4_4_ + iVar2;
      if ((tmp._4_4_ & 0xffffff88) != 0) {
        __assert_fail("IS_SQUARE(to)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x72d,"void clunk::Node::GetSliderChecks() [color = true]");
      }
      iVar3 = Direction(from_00,tmp._4_4_);
      if (iVar3 != iVar2) {
        __assert_fail("Direction(king, to) == dir",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x72e,"void clunk::Node::GetSliderChecks() [color = true]");
      }
      for (uStack_40 = *(ulong *)(_atk + (long)(int)tmp._4_4_ * 8); uStack_40 != 0;
          uStack_40 = uStack_40 >> 8) {
        if ((uStack_40 & 0xff) != 0) {
          from_01 = ((uint)uStack_40 & 0xff) - 1;
          if ((from_01 & 0xffffff88) != 0) {
            __assert_fail("IS_SQUARE(from)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x732,"void clunk::Node::GetSliderChecks() [color = true]");
          }
          if ((undefined *)(&_board)[(int)from_01] < _FIRST_SLIDER) {
            __assert_fail("_board[from] >= _FIRST_SLIDER",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x733,"void clunk::Node::GetSliderChecks() [color = true]");
          }
          if (*(byte *)(&_board)[(int)from_01] < 6 || 0xb < *(byte *)(&_board)[(int)from_01]) {
            __assert_fail("IS_SLIDER(_board[from]->type)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x734,"void clunk::Node::GetSliderChecks() [color = true]");
          }
          cVar1 = *(char *)(&_board)[(int)from_01];
          if (cVar1 == '\a') {
            iVar3 = Direction(from_01,tmp._4_4_);
            iVar4 = Direction(from_01,tmp._4_4_);
            iVar5 = Direction(from_01,tmp._4_4_);
            iVar6 = Direction(from_01,tmp._4_4_);
            if (((iVar3 != -0x11 && iVar4 != -0xf) && iVar5 != 0xf) && iVar6 != 0x11) {
              __assert_fail("IS_DIAG(Direction(from, to))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x737,"void clunk::Node::GetSliderChecks() [color = true]");
            }
            if ((undefined *)(&_board)[(int)tmp._4_4_] == _EMPTY) {
              if (((iVar2 == -0x11 || iVar2 == -0xf) || iVar2 == 0xf) || iVar2 == 0x11) {
                iVar3 = GetPinDir(this,true,from_01);
                if (iVar3 != 0) {
                  iVar4 = Direction(from_01,tmp._4_4_);
                  if (iVar4 < 1) {
                    iVar4 = -iVar4;
                  }
                  if (iVar4 != iVar3) goto LAB_0014d098;
                }
                AddMove(this,BishopMove,from_01,tmp._4_4_,
                        *(int *)(_SQR + (long)(int)tmp._4_4_ * 4) -
                        *(int *)(_SQR + (long)(int)from_01 * 4),0,0);
              }
            }
            else {
              iVar3 = Direction(tmp._4_4_,from_01);
              if (iVar3 == iVar2 && *(char *)(&_board)[(int)tmp._4_4_] == '\t') {
                GetSliderDiscovers(this,true,RookMove,
                                   *(uint64_t *)(_bishopRook + (long)(int)(tmp._4_4_ + 8) * 8),
                                   tmp._4_4_);
              }
            }
          }
          else if (cVar1 == '\t') {
            iVar3 = Direction(from_01,tmp._4_4_);
            iVar4 = Direction(from_01,tmp._4_4_);
            iVar5 = Direction(from_01,tmp._4_4_);
            iVar6 = Direction(from_01,tmp._4_4_);
            if (((iVar3 != -0x10 && iVar4 != -1) && iVar5 != 1) && iVar6 != 0x10) {
              __assert_fail("IS_CROSS(Direction(from, to))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x748,"void clunk::Node::GetSliderChecks() [color = true]");
            }
            if ((undefined *)(&_board)[(int)tmp._4_4_] == _EMPTY) {
              if (((iVar2 == -0x10 || iVar2 == -1) || iVar2 == 1) || iVar2 == 0x10) {
                iVar3 = GetPinDir(this,true,from_01);
                if (iVar3 != 0) {
                  iVar4 = Direction(from_01,tmp._4_4_);
                  if (iVar4 < 1) {
                    iVar4 = -iVar4;
                  }
                  if (iVar4 != iVar3) goto LAB_0014d098;
                }
                AddMove(this,RookMove,from_01,tmp._4_4_,
                        *(int *)(_SQR + (long)(int)tmp._4_4_ * 4) -
                        *(int *)(_SQR + (long)(int)from_01 * 4),0,0);
              }
            }
            else {
              iVar3 = Direction(tmp._4_4_,from_01);
              if (iVar3 == iVar2 && *(char *)(&_board)[(int)tmp._4_4_] == '\a') {
                GetSliderDiscovers(this,true,BishopMove,
                                   *(uint64_t *)(_bishopRook + (long)(int)tmp._4_4_ * 8),tmp._4_4_);
              }
            }
          }
          else if (cVar1 == '\v') {
            iVar3 = Direction(from_01,tmp._4_4_);
            iVar4 = Direction(from_01,tmp._4_4_);
            iVar5 = Direction(from_01,tmp._4_4_);
            iVar6 = Direction(from_01,tmp._4_4_);
            iVar7 = Direction(from_01,tmp._4_4_);
            iVar8 = Direction(from_01,tmp._4_4_);
            iVar9 = Direction(from_01,tmp._4_4_);
            iVar10 = Direction(from_01,tmp._4_4_);
            if ((((iVar3 != -0x11 && iVar4 != -0xf) && iVar5 != 0xf) && iVar6 != 0x11) &&
                (((iVar7 != -0x10 && iVar8 != -1) && iVar9 != 1) && iVar10 != 0x10)) {
              __assert_fail("IS_DIR(Direction(from, to))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x759,"void clunk::Node::GetSliderChecks() [color = true]");
            }
            if ((undefined *)(&_board)[(int)tmp._4_4_] == _EMPTY) {
              iVar3 = GetPinDir(this,true,from_01);
              if (iVar3 != 0) {
                iVar4 = Direction(from_01,tmp._4_4_);
                if (iVar4 < 1) {
                  iVar4 = -iVar4;
                }
                if (iVar4 != iVar3) goto LAB_0014d098;
              }
              AddMove(this,QueenMove,from_01,tmp._4_4_,
                      *(int *)(_SQR + (long)(int)tmp._4_4_ * 4) -
                      *(int *)(_SQR + (long)(int)from_01 * 4),0,0);
            }
            else {
              iVar3 = Direction(tmp._4_4_,from_01);
              if (iVar3 == iVar2) {
                if (*(char *)(&_board)[(int)tmp._4_4_] == '\a') {
                  if (((iVar2 == -0x10 || iVar2 == -1) || iVar2 == 1) || iVar2 == 0x10) {
                    GetSliderDiscovers(this,true,BishopMove,
                                       *(uint64_t *)(_bishopRook + (long)(int)tmp._4_4_ * 8),
                                       tmp._4_4_);
                  }
                }
                else if ((*(char *)(&_board)[(int)tmp._4_4_] == '\t') &&
                        (((iVar2 == -0x11 || iVar2 == -0xf) || iVar2 == 0xf) || iVar2 == 0x11)) {
                  GetSliderDiscovers(this,true,RookMove,
                                     *(uint64_t *)(_bishopRook + (long)(int)(tmp._4_4_ + 8) * 8),
                                     tmp._4_4_);
                }
              }
            }
          }
        }
LAB_0014d098:
      }
    } while (tmp._4_4_ != to_00 && (undefined *)(&_board)[(int)tmp._4_4_] == _EMPTY);
    _dir = _dir >> 8;
  } while( true );
}

Assistant:

void GetSliderChecks() {
    const int king = _KING[!color]->sqr;
    assert(IS_SQUARE(king));
    assert(_board[king] == _KING[!color]);

    int score;
    int pinDir;
    for (uint64_t mvs = _queenKing[king]; mvs; mvs >>= 8) {
      assert(mvs & 0xFF);
      const int end = ((mvs & 0xFF) - 1);
      const int dir = Direction(king, end);
      assert(IS_DIR(dir));
      for (int to = (king + dir);; to += dir) {
        assert(IS_SQUARE(to));
        assert(Direction(king, to) == dir);
        for (uint64_t tmp = _atk[to]; tmp; tmp >>= 8) {
          if (tmp & 0xFF) {
            const int from = ((tmp & 0xFF) - 1);
            assert(IS_SQUARE(from));
            assert(_board[from] >= _FIRST_SLIDER);
            assert(IS_SLIDER(_board[from]->type));
            switch (_board[from]->type) {
            case (color|Bishop):
              assert(IS_DIAG(Direction(from, to)));
              if (_board[to] == _EMPTY) {
                if (IS_DIAG(dir)) {
                  pinDir = GetPinDir(color, from);
                  if (!pinDir || (abs(Direction(from, to)) == pinDir)) {
                    score = (_SQR[to] - _SQR[from]);
                    AddMove(BishopMove, from, to, score);
                  }
                }
              }
              else if ((Direction(to, from) == dir) &
                       (_board[to]->type == (color|Rook)))
              {
                GetSliderDiscovers(color, RookMove, _bishopRook[to + 8], to);
              }
              break;
            case (color|Rook):
              assert(IS_CROSS(Direction(from, to)));
              if (_board[to] == _EMPTY) {
                if (IS_CROSS(dir)) {
                  pinDir = GetPinDir(color, from);
                  if (!pinDir || (abs(Direction(from, to)) == pinDir)) {
                    score = (_SQR[to] - _SQR[from]);
                    AddMove(RookMove, from, to, score);
                  }
                }
              }
              else if ((Direction(to, from) == dir) &
                       (_board[to]->type == (color|Bishop)))
              {
                GetSliderDiscovers(color, BishopMove, _bishopRook[to], to);
              }
              break;
            case (color|Queen):
              assert(IS_DIR(Direction(from, to)));
              if (_board[to] == _EMPTY) {
                pinDir = GetPinDir(color, from);
                if (!pinDir || (abs(Direction(from, to)) == pinDir)) {
                  score = (_SQR[to] - _SQR[from]);
                  AddMove(QueenMove, from, to, score);
                }
              }
              else if (Direction(to, from) == dir) {
                switch (_board[to]->type) {
                case (color|Bishop):
                  if (IS_CROSS(dir)) {
                    GetSliderDiscovers(color, BishopMove, _bishopRook[to], to);
                  }
                  break;
                case (color|Rook):
                  if (IS_DIAG(dir)) {
                    GetSliderDiscovers(color, RookMove, _bishopRook[to + 8], to);
                  }
                  break;
                }
              }
              break;
            }
          }
        }
        if ((to == end) | (_board[to] != _EMPTY)) {
          break;
        }
      }
    }
  }